

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  SystemInformationImplementation *pSVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  ulonglong uVar8;
  long *plVar9;
  long *plVar10;
  char cVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  undefined1 *puStack_390;
  long lStack_388;
  undefined1 uStack_380;
  undefined7 uStack_37f;
  string sStack_370;
  string sStack_350;
  SystemInformationImplementation *pSStack_330;
  void *pvStack_328;
  void *pvStack_320;
  long lStack_318;
  string sStack_308;
  string sStack_2e8;
  string sStack_2c8;
  long *plStack_2a8;
  long lStack_2a0;
  long lStack_298;
  long lStack_290;
  FILE *pFStack_288;
  string sStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  string sStack_c0;
  string sStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_60;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_390 = &uStack_380;
  lStack_388 = 0;
  uStack_380 = 0;
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    goto LAB_003f4e92;
  }
  iVar5 = feof(__stream);
  cVar11 = -2;
  if (iVar5 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&puStack_390);
      iVar5 = feof(__stream);
      cVar11 = cVar11 + '\x01';
    } while (iVar5 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&puStack_390,cVar11);
  lVar7 = std::__cxx11::string::find((char *)&puStack_390,0x570ba3,0);
  if (lVar7 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar7 = std::__cxx11::string::find((char *)&puStack_390,0x570ba3,lVar7 + 1);
    } while (lVar7 != -1);
  }
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_60._M_impl.super__Rb_tree_header._M_header;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_c0,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_a0,this,&sStack_c0,"physical id",0);
  pFStack_288 = __stream;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  pSStack_330 = this;
  if (this->CurrentPositionInFile != 0xffffffffffffffff) {
    do {
      sStack_2e8._M_dataplus._M_p._0_4_ = atoi(sStack_a0._M_dataplus._M_p);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &_Stack_60,(int *)&sStack_2e8);
      sStack_e0._M_dataplus._M_p = (pointer)&sStack_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_e0,puStack_390,puStack_390 + lStack_388);
      ExtractValueFromCpuInfoFile
                (&sStack_2c8,pSStack_330,&sStack_e0,"physical id",
                 pSStack_330->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&sStack_a0,(string *)&sStack_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_2c8._M_dataplus._M_p != &sStack_2c8.field_2) {
        operator_delete(sStack_2c8._M_dataplus._M_p,sStack_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
        operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
      }
    } while (pSStack_330->CurrentPositionInFile != 0xffffffffffffffff);
  }
  bVar15 = _Stack_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar5 = (int)_Stack_60._M_impl.super__Rb_tree_header._M_node_count;
  sStack_100._M_dataplus._M_p = (pointer)&sStack_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_100,puStack_390,puStack_390 + lStack_388);
  pSVar4 = pSStack_330;
  ExtractValueFromCpuInfoFile(&sStack_2c8,pSStack_330,&sStack_100,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_100._M_dataplus._M_p != &sStack_100.field_2) {
    operator_delete(sStack_100._M_dataplus._M_p,sStack_100.field_2._M_allocated_capacity + 1);
  }
  iVar6 = atoi(sStack_2c8._M_dataplus._M_p);
  iVar5 = (iVar5 + (uint)bVar15) * (iVar6 + (uint)(iVar6 == 0));
  uVar12 = iVar5 + (uint)(iVar5 == 0);
  pSVar4->NumberOfPhysicalCPU = uVar12;
  (pSVar4->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       pSVar4->NumberOfLogicalCPU / uVar12;
  sStack_120._M_dataplus._M_p = (pointer)&sStack_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_120,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_2e8,pSVar4,&sStack_120,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != &sStack_120.field_2) {
    operator_delete(sStack_120._M_dataplus._M_p,sStack_120.field_2._M_allocated_capacity + 1);
  }
  if (sStack_2e8._M_string_length == 0) {
    sStack_140._M_dataplus._M_p = (pointer)&sStack_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_140,puStack_390,puStack_390 + lStack_388);
    ExtractValueFromCpuInfoFile(&sStack_308,pSVar4,&sStack_140,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_2e8,(string *)&sStack_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_308._M_dataplus._M_p != &sStack_308.field_2) {
      operator_delete(sStack_308._M_dataplus._M_p,sStack_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_140._M_dataplus._M_p != &sStack_140.field_2) {
      operator_delete(sStack_140._M_dataplus._M_p,sStack_140.field_2._M_allocated_capacity + 1);
    }
    uVar8 = strtoull((char *)CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,
                                      (int)sStack_2e8._M_dataplus._M_p),(char **)0x0,0x10);
    fVar16 = (float)uVar8 / 1e+06;
  }
  else {
    dVar3 = atof((char *)CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,(int)sStack_2e8._M_dataplus._M_p
                                 ));
    fVar16 = (float)dVar3;
  }
  pSVar4->CPUSpeedInMHz = fVar16;
  sStack_160._M_dataplus._M_p = (pointer)&sStack_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_160,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_308,pSVar4,&sStack_160,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_160._M_dataplus._M_p != &sStack_160.field_2) {
    operator_delete(sStack_160._M_dataplus._M_p,sStack_160.field_2._M_allocated_capacity + 1);
  }
  if (sStack_308._M_string_length == 0) {
    sStack_180._M_dataplus._M_p = (pointer)&sStack_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_180,puStack_390,puStack_390 + lStack_388);
    ExtractValueFromCpuInfoFile(&sStack_350,pSVar4,&sStack_180,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_308,(string *)&sStack_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_350._M_dataplus._M_p != &sStack_350.field_2) {
      operator_delete(sStack_350._M_dataplus._M_p,sStack_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_180._M_dataplus._M_p != &sStack_180.field_2) {
      operator_delete(sStack_180._M_dataplus._M_p,sStack_180.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = atoi(sStack_308._M_dataplus._M_p);
  (pSVar4->ChipID).Family = iVar5;
  sStack_1a0._M_dataplus._M_p = (pointer)&sStack_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1a0,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_350,pSVar4,&sStack_1a0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(pSVar4->ChipID).Vendor,(string *)&sStack_350);
  paVar2 = &sStack_350.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_350._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_350._M_dataplus._M_p,sStack_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1a0._M_dataplus._M_p != &sStack_1a0.field_2) {
    operator_delete(sStack_1a0._M_dataplus._M_p,sStack_1a0.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(pSVar4,&sStack_308);
  if (((pSVar4->ChipID).Family == 0) && (pSVar4->ChipManufacturer == HP)) {
    iVar5 = std::__cxx11::string::compare((char *)&sStack_308);
    if (iVar5 == 0) {
      iVar5 = 0x11a;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&sStack_308);
      if (iVar5 != 0) goto LAB_003f46ac;
      iVar5 = 0x200;
    }
    (pSVar4->ChipID).Family = iVar5;
  }
LAB_003f46ac:
  sStack_1c0._M_dataplus._M_p = (pointer)&sStack_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1c0,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_350,pSVar4,&sStack_1c0,"model",0);
  _Var13._M_p = sStack_350._M_dataplus._M_p;
  iVar5 = atoi(sStack_350._M_dataplus._M_p);
  (pSVar4->ChipID).Model = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var13._M_p != paVar2) {
    operator_delete(_Var13._M_p,sStack_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
    operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
  }
  bVar15 = RetrieveClassicalCPUIdentity(pSVar4);
  if (!bVar15) {
    sStack_1e0._M_dataplus._M_p = (pointer)&sStack_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1e0,puStack_390,puStack_390 + lStack_388);
    ExtractValueFromCpuInfoFile(&sStack_350,pSVar4,&sStack_1e0,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1e0._M_dataplus._M_p != &sStack_1e0.field_2) {
      operator_delete(sStack_1e0._M_dataplus._M_p,sStack_1e0.field_2._M_allocated_capacity + 1);
    }
    if (sStack_350._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(pSVar4->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_350._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_350._M_dataplus._M_p,sStack_350.field_2._M_allocated_capacity + 1);
    }
  }
  sStack_200._M_dataplus._M_p = (pointer)&sStack_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_200,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_350,pSVar4,&sStack_200,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_200._M_dataplus._M_p != &sStack_200.field_2) {
    operator_delete(sStack_200._M_dataplus._M_p,sStack_200.field_2._M_allocated_capacity + 1);
  }
  if (sStack_350._M_string_length == 0) {
    sStack_220._M_dataplus._M_p = (pointer)&sStack_220.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_220,puStack_390,puStack_390 + lStack_388);
    ExtractValueFromCpuInfoFile(&sStack_370,pSVar4,&sStack_220,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_350,(string *)&sStack_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_370._M_dataplus._M_p != &sStack_370.field_2) {
      operator_delete(sStack_370._M_dataplus._M_p,sStack_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_220._M_dataplus._M_p != &sStack_220.field_2) {
      operator_delete(sStack_220._M_dataplus._M_p,sStack_220.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = atoi(sStack_350._M_dataplus._M_p);
  (pSVar4->ChipID).Revision = iVar5;
  sStack_240._M_dataplus._M_p = (pointer)&sStack_240.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_240,puStack_390,puStack_390 + lStack_388);
  ExtractValueFromCpuInfoFile(&sStack_370,pSVar4,&sStack_240,"model name",0);
  std::__cxx11::string::operator=((string *)&(pSVar4->ChipID).ModelName,(string *)&sStack_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_370._M_dataplus._M_p != &sStack_370.field_2) {
    operator_delete(sStack_370._M_dataplus._M_p,sStack_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_240._M_dataplus._M_p != &sStack_240.field_2) {
    operator_delete(sStack_240._M_dataplus._M_p,sStack_240.field_2._M_allocated_capacity + 1);
  }
  pvStack_328 = (void *)0x0;
  pvStack_320 = (void *)0x0;
  lStack_318 = 0;
  sStack_370._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&pvStack_328,(char **)&sStack_370);
  sStack_370._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&pvStack_328,(char **)&sStack_370);
  sStack_370._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&pvStack_328,(char **)&sStack_370);
  (pSVar4->Features).L1CacheSize = 0;
  if (pvStack_320 != pvStack_328) {
    uVar14 = 0;
    do {
      sStack_260._M_dataplus._M_p = (pointer)&sStack_260.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_260,puStack_390,puStack_390 + lStack_388);
      ExtractValueFromCpuInfoFile
                (&sStack_370,pSStack_330,&sStack_260,*(char **)((long)pvStack_328 + uVar14 * 8),0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_260._M_dataplus._M_p != &sStack_260.field_2) {
        operator_delete(sStack_260._M_dataplus._M_p,sStack_260.field_2._M_allocated_capacity + 1);
      }
      _Var13._M_p = sStack_370._M_dataplus._M_p;
      if (sStack_370._M_string_length != 0) {
        lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c56,0);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&plStack_2a8,(ulong)&sStack_370);
          std::__cxx11::string::operator=((string *)&sStack_370,(string *)&plStack_2a8);
          if (plStack_2a8 != &lStack_298) {
            operator_delete(plStack_2a8,lStack_298 + 1);
          }
        }
        _Var13._M_p = sStack_370._M_dataplus._M_p;
        iVar5 = atoi(sStack_370._M_dataplus._M_p);
        piVar1 = &(pSStack_330->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &sStack_370.field_2) {
        operator_delete(_Var13._M_p,sStack_370.field_2._M_allocated_capacity + 1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)pvStack_320 - (long)pvStack_328 >> 3));
  }
  sStack_280._M_dataplus._M_p = (pointer)&sStack_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_280,puStack_390,puStack_390 + lStack_388);
  pSVar4 = pSStack_330;
  ExtractValueFromCpuInfoFile(&sStack_370,pSStack_330,&sStack_280,"flags",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_280._M_dataplus._M_p != &sStack_280.field_2) {
    operator_delete(sStack_280._M_dataplus._M_p,sStack_280.field_2._M_allocated_capacity + 1);
  }
  if (sStack_350._M_string_length != 0) {
    std::operator+(&bStack_80," ",&sStack_370);
    plVar9 = (long *)std::__cxx11::string::append((char *)&bStack_80);
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      lStack_298 = *plVar10;
      lStack_290 = plVar9[3];
      plStack_2a8 = &lStack_298;
    }
    else {
      lStack_298 = *plVar10;
      plStack_2a8 = (long *)*plVar9;
    }
    lStack_2a0 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&sStack_370,(string *)&plStack_2a8);
    if (plStack_2a8 != &lStack_298) {
      operator_delete(plStack_2a8,lStack_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_80._M_dataplus._M_p != &bStack_80.field_2) {
      operator_delete(bStack_80._M_dataplus._M_p,bStack_80.field_2._M_allocated_capacity + 1);
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c5a,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasFPU = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c60,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasTSC = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c66,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasMMX = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c6c,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasSSE = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c72,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasSSE2 = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c79,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasAPIC = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c80,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasCMOV = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c87,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasMTRR = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c8e,0);
    if (lVar7 != -1) {
      (pSVar4->Features).HasACPI = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_370,0x570c95,0);
    if (lVar7 != -1) {
      (pSVar4->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_370._M_dataplus._M_p != &sStack_370.field_2) {
    operator_delete(sStack_370._M_dataplus._M_p,sStack_370.field_2._M_allocated_capacity + 1);
  }
  if (pvStack_328 != (void *)0x0) {
    operator_delete(pvStack_328,lStack_318 - (long)pvStack_328);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_350._M_dataplus._M_p != &sStack_350.field_2) {
    operator_delete(sStack_350._M_dataplus._M_p,sStack_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_308._M_dataplus._M_p != &sStack_308.field_2) {
    operator_delete(sStack_308._M_dataplus._M_p,sStack_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,(int)sStack_2e8._M_dataplus._M_p) !=
      &sStack_2e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,(int)sStack_2e8._M_dataplus._M_p),
                    sStack_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2c8._M_dataplus._M_p != &sStack_2c8.field_2) {
    operator_delete(sStack_2c8._M_dataplus._M_p,sStack_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_a0._M_dataplus._M_p != &sStack_a0.field_2) {
    operator_delete(sStack_a0._M_dataplus._M_p,sStack_a0.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_60);
LAB_003f4e92:
  if (puStack_390 != &uStack_380) {
    operator_delete(puStack_390,CONCAT71(uStack_37f,uStack_380) + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef _WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID) {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
  }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed()) {
    RetrieveClassicalCPUClockSpeed();
  }

  if (supportsCPUID) {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails()) {
      RetrieveClassicalCPUCacheDetails();
    }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity()) {
      RetrieveClassicalCPUIdentity();
    }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
  }

  this->CPUCountWindows();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetreiveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}